

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *logger;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues_00;
  string shLibsFilename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packageFiles;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  mapped_type *pmVar6;
  cmValue cVar7;
  cmValue numThreads;
  cmValue debianArchiveType;
  cmValue cVar8;
  undefined8 uVar9;
  undefined1 in_stack_fffffffffffffa18;
  string strGenWDIR;
  undefined1 in_stack_fffffffffffffa40;
  allocator<char> local_5ba;
  allocator<char> local_5b9;
  undefined1 local_5b8 [2];
  allocator<char> local_5b6;
  allocator<char> local_5b5;
  allocator<char> local_5b4;
  allocator<char> local_5b3;
  allocator<char> local_5b2;
  allocator<char> local_5b1;
  string shlibsfilename;
  undefined1 in_stack_fffffffffffffa70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  string postinst;
  DebGenerator gen;
  string local_2b8;
  string postrm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260;
  string local_240;
  string local_220 [32];
  string local_200;
  string local_1e0 [32];
  string local_1c0;
  string local_1a0 [32];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"GEN_CPACK_DEBIAN_PACKAGE_NAME",(allocator<char> *)&postinst);
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&strGenWDIR);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  cmsys::SystemTools::LowerCase((string *)&gen,psVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shlibsfilename,"Package",(allocator<char> *)&postrm);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&shlibsfilename);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&gen);
  std::__cxx11::string::~string((string *)&shlibsfilename);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",(allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Version",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",(allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Section",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",(allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Priority",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",
             (allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Architecture",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",(allocator<char> *)&shlibsfilename
            );
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Maintainer",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",
             (allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Description",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Source",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Depends",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Recommends",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Suggests",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Homepage",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Pre-Depends",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Enhances",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Breaks",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Conflicts",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Provides",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",(allocator<char> *)&strGenWDIR);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Replaces",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_WDIR",(allocator<char> *)&shlibsfilename);
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&strGenWDIR,(string *)psVar5);
  std::__cxx11::string::~string((string *)&gen);
  std::operator+(&shlibsfilename,&strGenWDIR,"/shlibs");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SHLIBS",(allocator<char> *)&postinst);
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS",(allocator<char> *)&postinst);
  bVar1 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (bVar1 && cVar7.Value != (string *)0x0) {
    bVar1 = (cVar7.Value)->_M_string_length != 0;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&gen);
  if (bVar1) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,None);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)&gen,&shlibsfilename,false,true);
    operator<<((ostream *)&gen,cVar7);
    std::operator<<((ostream *)&gen,'\n');
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  std::operator+(&postinst,&strGenWDIR,"/postinst");
  std::operator+(&postrm,&strGenWDIR,"/postrm");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTINST",(allocator<char> *)&local_2b8);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,None);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)&gen,&postinst,false,true);
    std::operator<<((ostream *)&gen,
                    "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"configure\" ]; then\n\tldconfig\nfi\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTRM",(allocator<char> *)&local_2b8);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,None);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)&gen,&postrm,false,true);
    std::operator<<((ostream *)&gen,
                    "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"remove\" ]; then\n\tldconfig\nfi\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"GEN_CPACK_OUTPUT_FILE_NAME",(allocator<char> *)(local_5b8 + 7));
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2b8);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_80,(string *)psVar5);
  std::__cxx11::string::string((string *)&local_a0,(string *)&strGenWDIR);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CPACK_TOPLEVEL_DIRECTORY",(allocator<char> *)(local_5b8 + 6));
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_e0);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)psVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)(local_5b8 + 5));
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_120);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_100,(string *)psVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",
             (allocator<char> *)(local_5b8 + 4));
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"CPACK_THREADS",(allocator<char> *)(local_5b8 + 3));
  numThreads = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE",(allocator<char> *)(local_5b8 + 2)
            );
  debianArchiveType = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_180);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  std::__cxx11::string::string(local_1a0,(string *)&shlibsfilename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"GEN_CPACK_DEBIAN_GENERATE_POSTINST",
             (allocator<char> *)(local_5b8 + 1));
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_1c0);
  std::__cxx11::string::string(local_1e0,(string *)&postinst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"GEN_CPACK_DEBIAN_GENERATE_POSTRM",(allocator<char> *)local_5b8);
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_200);
  std::__cxx11::string::string(local_220,(string *)&postrm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",&local_5b9);
  cVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",&local_5ba);
  bVar4 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_260);
  uVar9 = 0x1bd052;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_278,&this->packageFiles);
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = bVar1;
  controlValues_00._M_t._M_impl._0_8_ = &local_60;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_1a0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = bVar2;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ = 0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_1e0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = bVar3;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = 0;
  shLibsFilename._M_string_length._0_1_ = bVar4;
  shLibsFilename._M_dataplus._M_p = (pointer)cVar8.Value;
  shLibsFilename._M_string_length._1_7_ = 0;
  shLibsFilename.field_2._M_allocated_capacity = (size_type)&local_278;
  shLibsFilename.field_2._8_8_ = uVar9;
  packageFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  packageFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)controlValues._M_t._M_impl._0_8_;
  packageFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  packageFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown.dwarf_179e6c::DebGenerator::DebGenerator
            (&gen,logger,&local_80,&local_a0,&local_c0,&local_100,cVar7,numThreads,debianArchiveType
             ,controlValues_00,SUB81(local_220,0),shLibsFilename,(bool)in_stack_fffffffffffffa18,
             strGenWDIR,(bool)in_stack_fffffffffffffa40,_local_5b8,
             (cmValue)shlibsfilename.field_2._8_8_,(bool)in_stack_fffffffffffffa70,packageFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string(local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_2b8);
  bVar1 = anon_unknown.dwarf_179e6c::DebGenerator::generate(&gen);
  anon_unknown.dwarf_179e6c::DebGenerator::~DebGenerator(&gen);
  std::__cxx11::string::~string((string *)&postrm);
  std::__cxx11::string::~string((string *)&postinst);
  std::__cxx11::string::~string((string *)&shlibsfilename);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return bVar1;
}

Assistant:

bool cmCPackDebGenerator::createDeb()
{
  std::map<std::string, std::string> controlValues;

  // debian policy enforce lower case for package name
  controlValues["Package"] = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  controlValues["Version"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  controlValues["Section"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  controlValues["Priority"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  controlValues["Architecture"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  cmValue debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (cmNonempty(debian_pkg_source)) {
    controlValues["Source"] = *debian_pkg_source;
  }
  cmValue debian_pkg_dep = this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  if (cmNonempty(debian_pkg_dep)) {
    controlValues["Depends"] = *debian_pkg_dep;
  }
  cmValue debian_pkg_rec =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  if (cmNonempty(debian_pkg_rec)) {
    controlValues["Recommends"] = *debian_pkg_rec;
  }
  cmValue debian_pkg_sug =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  if (cmNonempty(debian_pkg_sug)) {
    controlValues["Suggests"] = *debian_pkg_sug;
  }
  cmValue debian_pkg_url =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  if (cmNonempty(debian_pkg_url)) {
    controlValues["Homepage"] = *debian_pkg_url;
  }
  cmValue debian_pkg_predep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  if (cmNonempty(debian_pkg_predep)) {
    controlValues["Pre-Depends"] = *debian_pkg_predep;
  }
  cmValue debian_pkg_enhances =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  if (cmNonempty(debian_pkg_enhances)) {
    controlValues["Enhances"] = *debian_pkg_enhances;
  }
  cmValue debian_pkg_breaks =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  if (cmNonempty(debian_pkg_breaks)) {
    controlValues["Breaks"] = *debian_pkg_breaks;
  }
  cmValue debian_pkg_conflicts =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  if (cmNonempty(debian_pkg_conflicts)) {
    controlValues["Conflicts"] = *debian_pkg_conflicts;
  }
  cmValue debian_pkg_provides =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  if (cmNonempty(debian_pkg_provides)) {
    controlValues["Provides"] = *debian_pkg_provides;
  }
  cmValue debian_pkg_replaces =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  if (cmNonempty(debian_pkg_replaces)) {
    controlValues["Replaces"] = *debian_pkg_replaces;
  }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));
  const std::string shlibsfilename = strGenWDIR + "/shlibs";

  cmValue debian_pkg_shlibs =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SHLIBS");
  const bool gen_shibs = this->IsOn("CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS") &&
    cmNonempty(debian_pkg_shlibs);
  if (gen_shibs) {
    cmGeneratedFileStream out;
    out.Open(shlibsfilename, false, true);
    out << debian_pkg_shlibs;
    out << '\n';
  }

  const std::string postinst = strGenWDIR + "/postinst";
  const std::string postrm = strGenWDIR + "/postrm";
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST")) {
    cmGeneratedFileStream out;
    out.Open(postinst, false, true);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"configure\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM")) {
    cmGeneratedFileStream out;
    out.Open(postrm, false, true);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"remove\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }

  DebGenerator gen(
    this->Logger, this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME"), strGenWDIR,
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("CPACK_THREADS"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, gen_shibs,
    shlibsfilename, this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST"), postinst,
    this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM"), postrm,
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA"),
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    this->packageFiles);

  return gen.generate();
}